

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall YAJLFrame::YAJLFrame(YAJLFrame *this,YAJLMiscData *misc,bitio_stream *bstream)

{
  u16 marker;
  uint uVar1;
  ssize_t sVar2;
  short sVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *extraout_RDX_04;
  bitio_stream *bstream_local;
  YAJLMiscData *misc_local;
  vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *local_60;
  YAJLFrameHeader local_58;
  
  bstream_local = bstream;
  misc_local = misc;
  YAJLTables::YAJLTables(&this->tables);
  local_60 = &(this->header).specs;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scans).super__Vector_base<YAJLScan,_std::allocator<YAJLScan>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __buf = extraout_RDX;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            sVar2 = bitio::bitio_stream::read(bstream_local,0x10,__buf,in_RCX);
            uVar1 = (uint)sVar2;
            in_RCX = (size_t)(uVar1 & 0xfff0);
            sVar3 = (short)(uVar1 & 0xfff0);
            if (sVar3 != -0x20) break;
            YAJLMiscData::fetch_app_data(misc_local,bstream_local);
            __buf = extraout_RDX_00;
          }
          marker = (u16)sVar2;
          if (marker != 0xffdb) break;
          YAJLTables::fetch_qtable(&this->tables,bstream_local);
          __buf = extraout_RDX_02;
        }
        if ((uVar1 & 0xffff) != 0xfffe) break;
        YAJLMiscData::fetch_comment(misc_local,bstream_local);
        __buf = extraout_RDX_01;
      }
      if ((uVar1 & 0xfff7) != 0xffc4) break;
      YAJLTables::fetch_etable(&this->tables,marker,bstream_local);
      __buf = extraout_RDX_03;
    }
    if ((uVar1 & 0xffff) != 0xffdc) break;
    bitio::bitio_stream::skip(bstream_local,0x10);
    sVar2 = bitio::bitio_stream::read(bstream_local,0x10,__buf_00,in_RCX);
    (this->header).nlines = (u16)sVar2;
    __buf = extraout_RDX_04;
  }
  if ((sVar3 == -0x40) &&
     ((uVar1 = (uVar1 & 0xffff) - 0xffc4, 8 < uVar1 || ((0x111U >> (uVar1 & 0x1f) & 1) == 0)))) {
    YAJLFrameHeader::YAJLFrameHeader(&local_58,marker,bstream_local);
    YAJLFrameHeader::operator=(&this->header,&local_58);
    std::_Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::~_Vector_base
              ((_Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_> *)
               ((long)&local_58 + 0x10));
    local_58._0_8_ = &this->header;
    std::vector<YAJLScan,std::allocator<YAJLScan>>::
    emplace_back<YAJLMiscData*&,YAJLFrameHeader*,bitio::bitio_stream*&>
              ((vector<YAJLScan,std::allocator<YAJLScan>> *)&this->scans,&misc_local,
               (YAJLFrameHeader **)&local_58,&bstream_local);
    printf("Run completed at: %s for \'Frame\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
          );
    return;
  }
  fprintf(_stderr,"Unhandled marker at: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
         );
  exit(1);
}

Assistant:

YAJLFrame::YAJLFrame(YAJLMiscData *misc, bitio::bitio_stream *bstream) {
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::DNL) {
            // skip the length parameter as we know that Nl is a u16.
            bstream->skip(0x10);
            header.nlines = bstream->read(0x10);
        } else if (markers::is_sof_marker(marker)) {
            header = YAJLFrameHeader(marker, bstream);
            // now we parse one Scan

            scans.emplace_back(misc, &header, bstream);
#ifdef DEBUG
            printf("Run completed at: %s for 'Frame'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}